

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

bool __thiscall
helics::FilterFederate::destinationProcessMessage
          (FilterFederate *this,ActionMessage *command,BasicHandleInfo *handle)

{
  atomic<int> *paVar1;
  GlobalFederateId fid;
  FilterInfo *pFVar2;
  pointer pcVar3;
  int iVar4;
  FilterCoordinator *fcoord;
  long *plVar5;
  uint32_t pid;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> nmessage;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> tempMessage;
  string odest;
  _Head_base<0UL,_helics::Message_*,_false> local_80;
  Message *local_78;
  Message *local_70;
  undefined4 local_64;
  _Head_base<0UL,_helics::Message_*,_false> local_60;
  _Head_base<0UL,_helics::Message_*,_false> local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  fcoord = getFilterCoordinator(this,(InterfaceHandle)(handle->handle).handle.hid);
  if (fcoord == (FilterCoordinator *)0x0) {
    return true;
  }
  pFVar2 = fcoord->destFilter;
  if ((pFVar2 != (FilterInfo *)0x0) && ((pFVar2->flags & 0x1000) == 0)) {
    if ((pFVar2->core_id).gid != (this->mFedID).gid) {
      LOCK();
      paVar1 = &this->messageCounter;
      iVar4 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pid = iVar4 + 1;
      fid.gid = (handle->handle).fed_id.gid;
      generateDestProcessMarker(this,fid,pid,(Time)(command->actionTime).internalTimeCode);
      ActionMessage::setAction(command,cmd_send_for_dest_filter_return);
      command->sequenceID = pid;
      (command->source_id).gid = fid.gid;
      (command->source_handle).hid = (handle->handle).handle.hid;
      pFVar2 = fcoord->destFilter;
      (command->dest_id).gid = (pFVar2->core_id).gid;
      (command->dest_handle).hid = (pFVar2->handle).hid;
      if ((this->mSendMessageMove).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->mSendMessageMove)._M_invoker)((_Any_data *)&this->mSendMessageMove,command);
        return false;
      }
      std::__throw_bad_function_call();
    }
    if ((pFVar2->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      createMessageFromCommand((helics *)&local_70,command);
      plVar5 = local_40;
      pcVar3 = (local_70->dest)._M_dataplus._M_p;
      local_50 = plVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + (local_70->dest)._M_string_length);
      local_78 = local_70;
      local_70 = (Message *)0x0;
      (*((fcoord->destFilter->filterOp).
         super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FilterOperator[2])(&local_80);
      if (local_78 != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_78,local_78);
      }
      local_78 = (Message *)0x0;
      if (local_48 == ((local_80._M_head_impl)->dest)._M_string_length) {
        if (local_48 == 0) {
          local_64 = (undefined4)CONCAT71((int7)((ulong)plVar5 >> 8),1);
        }
        else {
          iVar4 = bcmp(local_50,((local_80._M_head_impl)->dest)._M_dataplus._M_p,local_48);
          local_64 = (undefined4)CONCAT71((int7)((ulong)plVar5 >> 8),iVar4 == 0);
        }
      }
      else {
        local_64 = 0;
      }
      if ((char)local_64 == '\0') {
        local_60._M_head_impl = local_80._M_head_impl;
        local_80._M_head_impl = (Message *)0x0;
        ActionMessage::operator=
                  (command,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_60);
        if (local_60._M_head_impl != (Message *)0x0) {
          std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)&local_60,local_60._M_head_impl);
        }
        local_60._M_head_impl = (Message *)0x0;
        if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->mDeliverMessage)._M_invoker)((_Any_data *)&this->mDeliverMessage,command);
      }
      else {
        local_58._M_head_impl = local_80._M_head_impl;
        local_80._M_head_impl = (Message *)0x0;
        ActionMessage::operator=
                  (command,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_58);
        if (local_58._M_head_impl != (Message *)0x0) {
          std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)&local_58,local_58._M_head_impl);
        }
        local_58._M_head_impl = (Message *)0x0;
      }
      if (local_80._M_head_impl != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_80,local_80._M_head_impl);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_70 != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_70,local_70);
      }
      if ((char)local_64 == '\0') {
        return false;
      }
    }
  }
  if ((fcoord->cloningDestFilters).
      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (fcoord->cloningDestFilters).
      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    runCloningDestinationFilters(this,fcoord,handle,command);
  }
  return true;
}

Assistant:

bool FilterFederate::destinationProcessMessage(ActionMessage& command,
                                               const BasicHandleInfo* handle)
{
    auto* ffunc = getFilterCoordinator(handle->getInterfaceHandle());
    if (ffunc != nullptr) {
        if (ffunc->destFilter != nullptr) {
            if (!checkActionFlag(*(ffunc->destFilter), disconnected_flag)) {
                if (ffunc->destFilter->core_id != mFedID) {  // now we have deal with non-local
                                                             // processing destination filter
                    // first block the federate time advancement until the return is
                    // received
                    auto mid = ++messageCounter;
                    auto fed_id = handle->getFederateId();
                    generateDestProcessMarker(handle->getFederateId(), mid, command.actionTime);

                    // now send a message to get filtered
                    command.setAction(CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                    command.sequenceID = mid;
                    command.source_id = fed_id;
                    command.source_handle = handle->getInterfaceHandle();
                    command.dest_id = ffunc->destFilter->core_id;
                    command.dest_handle = ffunc->destFilter->handle;

                    mSendMessageMove(std::move(command));
                    return false;
                }
                // the filter is part of this core

                if (ffunc->destFilter->filterOp) {
                    auto tempMessage = createMessageFromCommand(std::move(command));
                    auto odest = tempMessage->dest;
                    auto nmessage = ffunc->destFilter->filterOp->process(std::move(tempMessage));
                    if (odest == nmessage->dest) {
                        command = std::move(nmessage);
                    } else {
                        // handle destination reroute filters
                        command = std::move(nmessage);
                        mDeliverMessage(command);
                        return false;
                    }
                }
            }
        }
        if (!ffunc->cloningDestFilters.empty()) {
            runCloningDestinationFilters(ffunc, handle, command);
        }
    }
    return true;
}